

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDF_String.cc
# Opt level: O2

string * __thiscall
QPDF_String::unparse_abi_cxx11_(string *__return_storage_ptr__,QPDF_String *this,bool force_binary)

{
  byte bVar1;
  size_type sVar2;
  bool bVar3;
  byte *pbVar4;
  undefined7 in_register_00000011;
  char cVar5;
  int in_R8D;
  size_type sVar6;
  uint uVar7;
  string local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  cVar5 = (char)__return_storage_ptr__;
  if ((int)CONCAT71(in_register_00000011,force_binary) == 0) {
    bVar3 = useHexString(this);
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    __return_storage_ptr__->_M_string_length = 0;
    (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
    if (!bVar3) {
      std::__cxx11::string::append((char *)__return_storage_ptr__);
      uVar7 = 0;
      do {
        if ((this->val)._M_string_length <= (ulong)uVar7) {
          std::__cxx11::string::append((char *)__return_storage_ptr__);
          return __return_storage_ptr__;
        }
        pbVar4 = (byte *)std::__cxx11::string::at((ulong)this);
        bVar1 = *pbVar4;
        switch(bVar1) {
        case 8:
          break;
        case 9:
          break;
        case 10:
          break;
        case 0xb:
switchD_001ca92e_caseD_b:
          if (bVar1 < 0xa0 && 0x5e < (byte)(bVar1 - 0x20)) {
            QUtil::int_to_string_base_abi_cxx11_(&local_70,(QUtil *)(ulong)bVar1,8,3,in_R8D);
            std::operator+(&local_50,"\\",&local_70);
            std::__cxx11::string::append((string *)__return_storage_ptr__);
            std::__cxx11::string::~string((string *)&local_50);
            std::__cxx11::string::~string((string *)&local_70);
          }
          else {
            std::__cxx11::string::at((ulong)this);
            std::__cxx11::string::push_back(cVar5);
          }
          goto LAB_001ca9b2;
        case 0xc:
          break;
        case 0xd:
          break;
        default:
          if (((bVar1 != 0x28) && (bVar1 != 0x29)) && (bVar1 != 0x5c))
          goto switchD_001ca92e_caseD_b;
        }
        std::__cxx11::string::append((char *)__return_storage_ptr__);
LAB_001ca9b2:
        uVar7 = uVar7 + 1;
      } while( true );
    }
  }
  else {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    __return_storage_ptr__->_M_string_length = 0;
    (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  }
  std::__cxx11::string::reserve((ulong)__return_storage_ptr__);
  std::__cxx11::string::push_back(cVar5);
  sVar2 = (this->val)._M_string_length;
  for (sVar6 = 0; sVar2 != sVar6; sVar6 = sVar6 + 1) {
    std::__cxx11::string::push_back(cVar5);
    std::__cxx11::string::push_back(cVar5);
  }
  std::__cxx11::string::push_back(cVar5);
  return __return_storage_ptr__;
}

Assistant:

std::string
QPDF_String::unparse(bool force_binary)
{
    bool use_hexstring = force_binary || useHexString();
    std::string result;
    if (use_hexstring) {
        static auto constexpr hexchars = "0123456789abcdef";
        result.reserve(2 * this->val.length() + 2);
        result += '<';
        for (const char c: this->val) {
            result += hexchars[static_cast<unsigned char>(c) >> 4];
            result += hexchars[c & 0x0f];
        }
        result += '>';
    } else {
        result += "(";
        for (unsigned int i = 0; i < this->val.length(); ++i) {
            char ch = this->val.at(i);
            switch (ch) {
            case '\n':
                result += "\\n";
                break;

            case '\r':
                result += "\\r";
                break;

            case '\t':
                result += "\\t";
                break;

            case '\b':
                result += "\\b";
                break;

            case '\f':
                result += "\\f";
                break;

            case '(':
                result += "\\(";
                break;

            case ')':
                result += "\\)";
                break;

            case '\\':
                result += "\\\\";
                break;

            default:
                if (is_iso_latin1_printable(ch)) {
                    result += this->val.at(i);
                } else {
                    result += "\\" +
                        QUtil::int_to_string_base(
                                  static_cast<int>(static_cast<unsigned char>(ch)), 8, 3);
                }
                break;
            }
        }
        result += ")";
    }

    return result;
}